

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QString * qt_accHotKey(QString *__return_storage_ptr__,QString *text)

{
  long in_FS_OFFSET;
  QKeySequence local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QKeySequence::mnemonic((QString *)local_20);
  QKeySequence::toString((SequenceFormat)__return_storage_ptr__);
  QKeySequence::~QKeySequence(local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qt_accHotKey(const QString &text)
{
#ifndef QT_NO_SHORTCUT
    return QKeySequence::mnemonic(text).toString(QKeySequence::NativeText);
#else
    Q_UNUSED(text);
#endif

    return QString();
}